

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::HandleExtremeFloatingPoint
                   (string *__return_storage_ptr__,string *val,bool add_float_suffix)

{
  bool bVar1;
  long lVar2;
  allocator<char> local_2e;
  allocator<char> local_2d [19];
  allocator<char> local_1a;
  byte local_19;
  string *psStack_18;
  bool add_float_suffix_local;
  string *val_local;
  
  local_19 = add_float_suffix;
  psStack_18 = val;
  val_local = __return_storage_ptr__;
  bVar1 = std::operator==(val,"nan");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"NAN",&local_1a);
    std::allocator<char>::~allocator(&local_1a);
    return __return_storage_ptr__;
  }
  bVar1 = std::operator==(val,"inf");
  if (!bVar1) {
    bVar1 = std::operator==(val,"-inf");
    if (!bVar1) {
      if (((local_19 & 1) != 0) &&
         (((lVar2 = std::__cxx11::string::find((char *)val,0x5deb30), lVar2 != -1 ||
           (lVar2 = std::__cxx11::string::find((char *)val,0x5d9b5f), lVar2 != -1)) ||
          (lVar2 = std::__cxx11::string::find((char *)val,0x634992), lVar2 != -1)))) {
        std::__cxx11::string::operator+=((string *)val,"f");
      }
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)val);
      return __return_storage_ptr__;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"-INFINITY",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    return __return_storage_ptr__;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"INFINITY",local_2d);
  std::allocator<char>::~allocator(local_2d);
  return __return_storage_ptr__;
}

Assistant:

static string HandleExtremeFloatingPoint(string val, bool add_float_suffix) {
  if (val == "nan") {
    return "NAN";
  } else if (val == "inf") {
    return "INFINITY";
  } else if (val == "-inf") {
    return "-INFINITY";
  } else {
    // float strings with ., e or E need to have f appended
    if (add_float_suffix &&
        (val.find(".") != string::npos || val.find("e") != string::npos ||
         val.find("E") != string::npos)) {
      val += "f";
    }
    return val;
  }
}